

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_fixup_pass.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_0::ReplaceInternalInterpolate
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  uint32_t uVar1;
  uint __line;
  uint32_t uVar2;
  uint32_t uVar3;
  FeatureManager *pFVar4;
  DefUseManager *this;
  Instruction *this_00;
  Instruction *this_01;
  char *__assertion;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  uint32_t local_c4;
  uint32_t local_c0;
  uint32_t local_bc;
  uint32_t local_b8;
  Op local_b4;
  IRContext *local_b0;
  OperandList new_operands;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  pFVar4 = IRContext::get_feature_mgr(ctx);
  uVar1 = pFVar4->extinst_importid_GLSLstd450_;
  if (uVar1 == 0) {
    __assertion = "glsl450_ext_inst_id != 0";
    __line = 0x27;
  }
  else {
    uVar2 = Instruction::GetSingleWordInOperand(inst,1);
    uVar3 = Instruction::GetSingleWordInOperand(inst,2);
    this = IRContext::get_def_use_mgr(ctx);
    this_00 = analysis::DefUseManager::GetDef(this,uVar3);
    local_b4 = this_00->opcode_;
    if (local_b4 != OpLoad) {
LAB_005045d4:
      return local_b4 == OpLoad;
    }
    this_01 = Instruction::GetBaseAddress(this_00);
    if (this_01->opcode_ == OpVariable) {
      local_c0 = 0;
      uVar3 = Instruction::GetSingleWordInOperand(this_01,0);
      if (uVar3 == 1) {
        local_b0 = ctx;
        local_b8 = Instruction::GetSingleWordInOperand(this_00,0);
        local_bc = uVar2;
        if (uVar2 != 0x4c) {
          local_c0 = Instruction::GetSingleWordInOperand(inst,3);
        }
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        init_list._M_len = 1;
        init_list._M_array = &local_c4;
        local_c4 = uVar1;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
        local_88.type = SPV_OPERAND_TYPE_ID;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&new_operands,&local_88);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
        local_c4 = local_bc;
        init_list_00._M_len = 1;
        init_list_00._M_array = &local_c4;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
        local_88.type = SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&new_operands,&local_88);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
        local_c4 = local_b8;
        init_list_01._M_len = 1;
        init_list_01._M_array = &local_c4;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_01);
        local_88.type = SPV_OPERAND_TYPE_ID;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&new_operands,&local_88);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
        if (local_c0 != 0) {
          local_c4 = local_c0;
          init_list_02._M_len = 1;
          init_list_02._M_array = &local_c4;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_02);
          local_88.type = SPV_OPERAND_TYPE_ID;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&new_operands,&local_88);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
        }
        Instruction::SetInOperands(inst,&new_operands);
        IRContext::UpdateDefUse(local_b0,inst);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&new_operands);
        goto LAB_005045d4;
      }
    }
    __assertion = 
    "base_inst->opcode() == spv::Op::OpVariable && spv::StorageClass(base_inst->GetSingleWordInOperand( kSpvVariableStorageClassInIdx)) == spv::StorageClass::Input && \"unexpected interpolant in InterpolateAt*\""
    ;
    __line = 0x34;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interp_fixup_pass.cpp"
                ,__line,
                "bool spvtools::opt::(anonymous namespace)::ReplaceInternalInterpolate(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
               );
}

Assistant:

bool ReplaceInternalInterpolate(IRContext* ctx, Instruction* inst,
                                const std::vector<const analysis::Constant*>&) {
  uint32_t glsl450_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  assert(glsl450_ext_inst_id != 0);

  uint32_t ext_opcode = inst->GetSingleWordInOperand(1);

  uint32_t op1_id = inst->GetSingleWordInOperand(2);

  Instruction* load_inst = ctx->get_def_use_mgr()->GetDef(op1_id);
  if (load_inst->opcode() != spv::Op::OpLoad) return false;

  Instruction* base_inst = load_inst->GetBaseAddress();
  USE_ASSERT(base_inst->opcode() == spv::Op::OpVariable &&
             spv::StorageClass(base_inst->GetSingleWordInOperand(
                 kSpvVariableStorageClassInIdx)) == spv::StorageClass::Input &&
             "unexpected interpolant in InterpolateAt*");

  uint32_t ptr_id = load_inst->GetSingleWordInOperand(0);
  uint32_t op2_id = (ext_opcode != GLSLstd450InterpolateAtCentroid)
                        ? inst->GetSingleWordInOperand(3)
                        : 0;

  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {glsl450_ext_inst_id}});
  new_operands.push_back(
      {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {ext_opcode}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {ptr_id}});
  if (op2_id != 0) new_operands.push_back({SPV_OPERAND_TYPE_ID, {op2_id}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}